

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O0

uint gcd(uint a,uint b)

{
  uint uVar1;
  undefined4 local_10;
  uint t;
  uint b_local;
  uint a_local;
  
  local_10 = b;
  t = a;
  while (local_10 != 0) {
    uVar1 = t % local_10;
    t = local_10;
    local_10 = uVar1;
  }
  return t;
}

Assistant:

unsigned int gcd(unsigned int a, unsigned int b)
{
	/* Use the division-based version of Euclid's algorithm. */
	while (b) {
		unsigned int t = b;

		b = a % b;
		a = t;
	}
	return a;
}